

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O0

char * __thiscall Pager::getPage(Pager *this,uint32_t pageNum)

{
  char *__buf;
  ssize_t sVar1;
  ssize_t numOfBytesRead;
  uint32_t numOfPages_;
  char *page;
  uint32_t pageNum_local;
  Pager *this_local;
  
  if (100 < pageNum) {
    std::operator<<((ostream *)&std::cout,"This page number is out of bounds.\n");
    exit(1);
  }
  if (this->pages[pageNum] == (char *)0x0) {
    __buf = (char *)operator_new__(0x1000);
    numOfBytesRead._4_4_ = this->fileLength >> 0xc;
    if ((this->fileLength & 0xfff) != 0) {
      numOfBytesRead._4_4_ = numOfBytesRead._4_4_ + 1;
    }
    if (pageNum <= numOfBytesRead._4_4_) {
      lseek(this->fileDescriptor,(ulong)(pageNum << 0xc),0);
      sVar1 = read(this->fileDescriptor,__buf,0x1000);
      if (sVar1 == -1) {
        std::operator<<((ostream *)&std::cout,"Error reading file\n");
        exit(1);
      }
    }
    this->pages[pageNum] = __buf;
    if (this->numOfPages <= pageNum) {
      this->numOfPages = pageNum + 1;
    }
  }
  return this->pages[pageNum];
}

Assistant:

char *Pager::getPage(uint32_t pageNum) {
	if (pageNum > MAX_PAGES) {
		std::cout << "This page number is out of bounds.\n";
		exit(EXIT_FAILURE);
	}

	if (pages[pageNum] == nullptr) {
		char *page = new char[PAGE_SIZE];
		uint32_t numOfPages_ = fileLength / PAGE_SIZE;

		//incomplete page
		if(fileLength % PAGE_SIZE) {
			numOfPages_ += 1;
		}

		if (pageNum <= numOfPages_) {
			lseek(fileDescriptor, pageNum * PAGE_SIZE, SEEK_SET);
			ssize_t numOfBytesRead = read(fileDescriptor, page, PAGE_SIZE);
			if (numOfBytesRead == -1) {
				std::cout << "Error reading file\n";
				exit(EXIT_FAILURE);
			}
		}
		pages[pageNum] = page;
		if (pageNum >= numOfPages) {
			this->numOfPages = pageNum + 1;
		}
	}
	return pages[pageNum];
}